

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::a64::ARMRAPass::onInit(ARMRAPass *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t regId;
  uint32_t uVar4;
  uint32_t *puVar5;
  uchar *puVar6;
  BaseRAPass *in_RDI;
  bool hasFP;
  Arch arch;
  RegGroup *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  RegGroup group;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint32_t local_a8;
  undefined1 local_a1;
  uint32_t local_a0;
  undefined1 local_99;
  uint32_t local_98;
  undefined1 local_91;
  uint32_t local_90;
  Arch local_89;
  FuncNode *local_80;
  BaseBuilder *local_68;
  Arch local_59;
  uint32_t *local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  FuncFrame *local_38;
  BaseBuilder *local_30;
  BaseBuilder *local_28;
  Environment *local_20;
  Environment *local_18;
  undefined4 local_c;
  FuncFrame *local_8;
  
  local_68 = (in_RDI->super_FuncPass).super_Pass._cb;
  local_18 = &(local_68->super_BaseEmitter)._environment;
  local_89 = local_18->_arch;
  in_RDI[1].super_FuncPass.super_Pass._cb = (in_RDI->super_FuncPass).super_Pass._cb;
  in_RDI->_archTraits = (ArchTraits *)(_archTraits + (ulong)local_89 * 0xd8);
  local_59 = local_89;
  local_30 = local_68;
  RARegCount::set((RARegCount *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (RegGroup)((ulong)in_RDI >> 0x38),(uint32_t)in_RDI);
  RARegCount::set((RARegCount *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (RegGroup)((ulong)in_RDI >> 0x38),(uint32_t)in_RDI);
  RARegCount::set((RARegCount *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (RegGroup)((ulong)in_RDI >> 0x38),(uint32_t)in_RDI);
  RARegCount::set((RARegCount *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (RegGroup)((ulong)in_RDI >> 0x38),(uint32_t)in_RDI);
  BaseRAPass::_buildPhysIndex
            ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  (in_RDI->_availableRegCount).field_0 = (in_RDI->_physRegCount).field_0;
  local_90 = RARegCount::get((RARegCount *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (RegGroup)((uint)in_stack_ffffffffffffff34 >> 0x18));
  local_40 = &local_90;
  uVar2 = (int)(1L << ((byte)local_90 & 0x3f)) - 1;
  local_91 = 0;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(in_stack_ffffffffffffff34,uVar2),
                      in_stack_ffffffffffffff28);
  *puVar5 = uVar2;
  local_98 = RARegCount::get((RARegCount *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (RegGroup)((uint)in_stack_ffffffffffffff34 >> 0x18));
  local_48 = &local_98;
  uVar3 = (int)(1L << ((byte)local_98 & 0x3f)) - 1;
  local_99 = 1;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffff28);
  *puVar5 = uVar3;
  local_a0 = RARegCount::get((RARegCount *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (RegGroup)(uVar3 >> 0x18));
  local_50 = &local_a0;
  regId = (int)(1L << ((byte)local_a0 & 0x3f)) - 1;
  local_a1 = 2;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffff28);
  *puVar5 = regId;
  local_a8 = RARegCount::get((RARegCount *)CONCAT44(in_stack_ffffffffffffff3c,regId),
                             (RegGroup)(uVar3 >> 0x18));
  local_58 = &local_a8;
  uVar4 = (int)(1L << ((byte)local_a8 & 0x3f)) - 1;
  puVar5 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffff28);
  *puVar5 = uVar4;
  puVar6 = Support::Array<unsigned_char,_2UL>::operator[]<int>
                     ((Array<unsigned_char,_2UL> *)CONCAT44(uVar3,uVar2),
                      (int *)in_stack_ffffffffffffff28);
  group = (RegGroup)(uVar4 >> 0x18);
  *puVar6 = '\x1b';
  puVar6 = Support::Array<unsigned_char,_2UL>::operator[]<int>
                     ((Array<unsigned_char,_2UL> *)CONCAT44(uVar3,uVar2),
                      (int *)in_stack_ffffffffffffff28);
  *puVar6 = '\x1c';
  local_80 = in_RDI->_func;
  local_38 = &local_80->_frame;
  local_c = 0x10;
  local_8 = local_38;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (local_38->_attributes,kHasPreservedFP);
  if (!bVar1) {
    local_28 = (in_RDI->super_FuncPass).super_Pass._cb;
    local_20 = &(local_28->super_BaseEmitter)._environment;
    if ((local_28->super_BaseEmitter)._environment._platformABI != kDarwin) goto LAB_001a00c2;
  }
  BaseRAPass::makeUnavailable(in_RDI,group,regId);
LAB_001a00c2:
  BaseRAPass::makeUnavailable(in_RDI,group,regId);
  BaseRAPass::makeUnavailable(in_RDI,group,regId);
  (in_RDI->_sp).super_Operand.super_Operand_._signature = 0x8000039;
  (in_RDI->_sp).super_Operand.super_Operand_._baseId = 0x1f;
  (in_RDI->_sp).super_Operand.super_Operand_._data[0] = 0;
  (in_RDI->_sp).super_Operand.super_Operand_._data[1] = 0;
  (in_RDI->_fp).super_Operand.super_Operand_._signature = 0x8000039;
  (in_RDI->_fp).super_Operand.super_Operand_._baseId = 0x1d;
  (in_RDI->_fp).super_Operand.super_Operand_._data[0] = 0;
  (in_RDI->_fp).super_Operand.super_Operand_._data[1] = 0;
  return;
}

Assistant:

void ARMRAPass::onInit() noexcept {
  Arch arch = cc()->arch();

  _emitHelper._emitter = _cb;

  _archTraits = &ArchTraits::byArch(arch);
  _physRegCount.set(RegGroup::kGp, 32);
  _physRegCount.set(RegGroup::kVec, 32);
  _physRegCount.set(RegGroup::kMask, 0);
  _physRegCount.set(RegGroup::kExtraVirt3, 0);
  _buildPhysIndex();

  _availableRegCount = _physRegCount;
  _availableRegs[RegGroup::kGp] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kGp));
  _availableRegs[RegGroup::kVec] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kVec));
  _availableRegs[RegGroup::kMask] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kMask));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt3));

  _scratchRegIndexes[0] = uint8_t(27);
  _scratchRegIndexes[1] = uint8_t(28);

  // The architecture specific setup makes implicitly all registers available. So
  // make unavailable all registers that are special and cannot be used in general.
  bool hasFP = _func->frame().hasPreservedFP();

  // Apple ABI requires that the frame-pointer register is not changed by leaf functions and properly updated
  // by non-leaf functions. So, let's make this register unavailable as it's just not safe to update it.
  if (hasFP || cc()->environment().isDarwin())
    makeUnavailable(RegGroup::kGp, Gp::kIdFp);

  makeUnavailable(RegGroup::kGp, Gp::kIdSp);
  makeUnavailable(RegGroup::kGp, Gp::kIdOs); // OS-specific use, usually TLS.

  _sp = sp;
  _fp = x29;
}